

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void f_parser(lua_State *L,void *ud)

{
  long lVar1;
  byte *pbVar2;
  uint local_30;
  int c;
  SParser *p;
  LClosure *cl;
  void *ud_local;
  lua_State *L_local;
  
  lVar1 = **ud;
  **ud = lVar1 + -1;
  if (lVar1 == 0) {
    local_30 = luaZ_fill(*ud);
  }
  else {
    pbVar2 = *(byte **)(*ud + 8);
    *(byte **)(*ud + 8) = pbVar2 + 1;
    local_30 = (uint)*pbVar2;
  }
  if (local_30 == 0x1b) {
    checkmode(L,*(char **)((long)ud + 0x50),"binary");
    p = (SParser *)luaU_undump(L,*ud,*(char **)((long)ud + 0x58));
  }
  else {
    checkmode(L,*(char **)((long)ud + 0x50),"text");
    p = (SParser *)
        luaY_parser(L,*ud,(Mbuffer *)((long)ud + 8),(Dyndata *)((long)ud + 0x20),
                    *(char **)((long)ud + 0x58),local_30);
  }
  luaF_initupvals(L,(LClosure *)p);
  return;
}

Assistant:

static void f_parser(lua_State *L, void *ud) {
    LClosure *cl;
    struct SParser *p = cast(struct SParser *, ud);
    int c = zgetc(p->z);  /* read first character */
    if (c == LUA_SIGNATURE[0]) {
        checkmode(L, p->mode, "binary");
        cl = luaU_undump(L, p->z, p->name);
    } else {
        checkmode(L, p->mode, "text");
        cl = luaY_parser(L, p->z, &p->buff, &p->dyd, p->name, c);
    }
    lua_assert(cl->nupvalues == cl->p->sizeupvalues);
    luaF_initupvals(L, cl);
}